

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkSuperChoice(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  Map_Node_t *pMVar2;
  int iVar3;
  void *pvVar4;
  Mio_Library_t *pLib;
  Map_Man_t *p;
  long lVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  Map_Node_t **ppMVar6;
  Abc_Obj_t *pAVar7;
  ProgressBar *p_00;
  Vec_Ptr_t *pVVar8;
  Map_Cut_t *pMVar9;
  long lVar10;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x219,"Abc_Ntk_t *Abc_NtkSuperChoice(Abc_Ntk_t *)");
  }
  pvVar4 = Abc_FrameReadLibGen();
  if (pvVar4 == (void *)0x0) {
    puts("The current library is not available.");
  }
  else {
    pvVar4 = Abc_FrameReadLibSuper();
    if ((pvVar4 == (void *)0x0) && (pvVar4 = Abc_FrameReadLibGen(), pvVar4 != (void *)0x0)) {
      pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
      Map_SuperLibDeriveFromGenlib(pLib,0);
    }
    iVar3 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar3 != 0) {
      puts("Performing mapping with choices.");
    }
    p = Abc_NtkToMap(pNtk,-1.0,1,(float *)0x0,0);
    if (p == (Map_Man_t *)0x0) {
      return (Abc_Ntk_t *)0x0;
    }
    iVar3 = Map_Mapping(p);
    if (iVar3 == 0) {
      Map_ManFree(p);
    }
    else {
      lVar5 = (long)pNtk->vCis->nSize;
      if (0 < lVar5) {
        ppvVar1 = pNtk->vCis->pArray;
        lVar10 = 0;
        do {
          pvVar4 = ppvVar1[lVar10];
          *(undefined8 *)((long)pvVar4 + 8) = *(undefined8 *)((long)pvVar4 + 0x40);
          lVar10 = lVar10 + 1;
        } while (lVar5 != lVar10);
      }
      lVar5 = (long)pNtk->vPos->nSize;
      if (0 < lVar5) {
        ppvVar1 = pNtk->vPos->pArray;
        lVar10 = 0;
        do {
          pvVar4 = ppvVar1[lVar10];
          *(undefined8 *)((long)pvVar4 + 8) = *(undefined8 *)((long)pvVar4 + 0x40);
          lVar10 = lVar10 + 1;
        } while (lVar5 != lVar10);
      }
      lVar5 = (long)pNtk->vObjs->nSize;
      if (0 < lVar5) {
        ppvVar1 = pNtk->vObjs->pArray;
        lVar10 = 0;
        do {
          pvVar4 = ppvVar1[lVar10];
          if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
            *(undefined8 *)((long)pvVar4 + 8) = *(undefined8 *)((long)pvVar4 + 0x40);
          }
          lVar10 = lVar10 + 1;
        } while (lVar5 != lVar10);
      }
      pNtk_00 = Abc_NtkDup(pNtk);
      pNtk_01 = Abc_NtkMulti(pNtk_00,0,0x14,0,0,1,0);
      iVar3 = Abc_NtkBddToSop(pNtk_01,-1,1000000000);
      if (iVar3 == 0) {
        puts("Abc_NtkFromMapSuperChoice(): Converting to SOPs has failed.");
        pNtk_01 = (Abc_Ntk_t *)0x0;
      }
      else {
        pVVar8 = pNtk->vCis;
        if (0 < pVVar8->nSize) {
          lVar5 = 0;
          do {
            *(undefined8 *)((long)pVVar8->pArray[lVar5] + 0x40) =
                 *(undefined8 *)(*(long *)((long)pVVar8->pArray[lVar5] + 0x40) + 0x40);
            lVar5 = lVar5 + 1;
            pVVar8 = pNtk->vCis;
          } while (lVar5 < pVVar8->nSize);
        }
        pVVar8 = pNtk->vPos;
        if (0 < pVVar8->nSize) {
          lVar5 = 0;
          do {
            *(undefined8 *)((long)pVVar8->pArray[lVar5] + 0x40) =
                 *(undefined8 *)(*(long *)((long)pVVar8->pArray[lVar5] + 0x40) + 0x40);
            lVar5 = lVar5 + 1;
            pVVar8 = pNtk->vPos;
          } while (lVar5 < pVVar8->nSize);
        }
        pVVar8 = pNtk->vObjs;
        if (0 < pVVar8->nSize) {
          lVar5 = 0;
          do {
            pvVar4 = pVVar8->pArray[lVar5];
            if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
              *(undefined8 *)((long)pvVar4 + 0x40) =
                   *(undefined8 *)(*(long *)((long)pvVar4 + 0x40) + 0x40);
            }
            lVar5 = lVar5 + 1;
            pVVar8 = pNtk->vObjs;
          } while (lVar5 < pVVar8->nSize);
        }
        Abc_NtkDelete(pNtk_00);
        pVVar8 = pNtk->vCis;
        if (0 < pVVar8->nSize) {
          lVar5 = 0;
          do {
            pvVar4 = pVVar8->pArray[lVar5];
            ppMVar6 = Map_ManReadInputs(p);
            pMVar2 = ppMVar6[lVar5];
            pAVar7 = Abc_NtkCreateNodeInv(pNtk_01,*(Abc_Obj_t **)((long)pvVar4 + 0x40));
            Map_NodeSetData(pMVar2,0,(char *)pAVar7);
            ppMVar6 = Map_ManReadInputs(p);
            Map_NodeSetData(ppMVar6[lVar5],1,*(char **)((long)pvVar4 + 0x40));
            lVar5 = lVar5 + 1;
            pVVar8 = pNtk->vCis;
          } while (lVar5 < pVVar8->nSize);
        }
        pVVar8 = pNtk->vObjs;
        iVar3 = pVVar8->nSize;
        if (0 < iVar3) {
          lVar5 = 0;
          do {
            pvVar4 = pVVar8->pArray[lVar5];
            if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
              pMVar2 = *(Map_Node_t **)((long)pvVar4 + 8);
              pAVar7 = Abc_NtkCreateNodeInv(pNtk_01,*(Abc_Obj_t **)((long)pvVar4 + 0x40));
              Map_NodeSetData(pMVar2,0,(char *)pAVar7);
              Map_NodeSetData(*(Map_Node_t **)((long)pvVar4 + 8),1,*(char **)((long)pvVar4 + 0x40));
            }
            lVar5 = lVar5 + 1;
            pVVar8 = pNtk->vObjs;
            iVar3 = pVVar8->nSize;
          } while (lVar5 < iVar3);
        }
        p_00 = Extra_ProgressBarStart(_stdout,iVar3);
        pVVar8 = pNtk->vObjs;
        if (0 < pVVar8->nSize) {
          lVar5 = 0;
          do {
            pvVar4 = pVVar8->pArray[lVar5];
            if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) {
              if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar5)) {
                Extra_ProgressBarUpdate_int(p_00,(int)lVar5,(char *)0x0);
              }
              pMVar9 = Map_NodeReadCuts(*(Map_Node_t **)((long)pvVar4 + 8));
              for (pMVar9 = Map_CutReadNext(pMVar9); pMVar9 != (Map_Cut_t *)0x0;
                  pMVar9 = Map_CutReadNext(pMVar9)) {
                Abc_NodeFromMapCutPhase(pNtk_01,pMVar9,0);
                Abc_NodeFromMapCutPhase(pNtk_01,pMVar9,1);
              }
            }
            lVar5 = lVar5 + 1;
            pVVar8 = pNtk->vObjs;
          } while (lVar5 < pVVar8->nSize);
        }
        Extra_ProgressBarStop(p_00);
      }
      if (pNtk_01 != (Abc_Ntk_t *)0x0) {
        Map_ManFree(p);
        iVar3 = Abc_NtkCheck(pNtk_01);
        if (iVar3 != 0) {
          return pNtk_01;
        }
        puts("Abc_NtkMap: The network check has failed.");
        Abc_NtkDelete(pNtk_01);
      }
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkSuperChoice( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;

    Map_Man_t * pMan;

    assert( Abc_NtkIsStrash(pNtk) );

    // check that the library is available
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // derive the supergate library
    if ( Abc_FrameReadLibSuper() == NULL && Abc_FrameReadLibGen() )
    {
//        printf( "A simple supergate library is derived from gate library \"%s\".\n", 
//            Mio_LibraryReadName((Mio_Library_t *)Abc_FrameReadLibGen()) );
        Map_SuperLibDeriveFromGenlib( (Mio_Library_t *)Abc_FrameReadLibGen(), 0 );
    }

    // print a warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing mapping with choices.\n" );

    // perform the mapping
    pMan = Abc_NtkToMap( pNtk, -1, 1, NULL, 0 );
    if ( pMan == NULL )
        return NULL;
    if ( !Map_Mapping( pMan ) )
    {
        Map_ManFree( pMan );
        return NULL;
    }

    // reconstruct the network after mapping
    pNtkNew = Abc_NtkFromMapSuperChoice( pMan, pNtk );
    if ( pNtkNew == NULL )
        return NULL;
    Map_ManFree( pMan );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkMap: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}